

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_insertDUBT1(ZSTD_matchState_t *ms,U32 current,BYTE *inputEnd,U32 nbCompares,U32 btLow,
                     ZSTD_dictMode_e dictMode)

{
  uint uVar1;
  ZSTD_dictMode_e ZVar2;
  U32 *pUVar3;
  size_t sVar4;
  BYTE *local_100;
  BYTE *local_f8;
  uint local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  BYTE *mBase;
  size_t matchLength;
  U32 *nextPtr;
  U32 windowLow;
  U32 maxDistance;
  U32 windowValid;
  U32 dummy32;
  U32 matchIndex;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  BYTE *iend;
  BYTE *ip;
  BYTE *pBStack_68;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  ZSTD_compressionParameters *cParams;
  U32 local_28;
  ZSTD_dictMode_e dictMode_local;
  U32 btLow_local;
  U32 nbCompares_local;
  BYTE *inputEnd_local;
  ZSTD_matchState_t *pZStack_10;
  U32 current_local;
  ZSTD_matchState_t *ms_local;
  
  bt = &(ms->cParams).windowLog;
  _btMask = ms->chainTable;
  commonLengthSmaller._4_4_ = (ms->cParams).chainLog - 1;
  commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
  commonLengthLarger = 0;
  base = (BYTE *)0x0;
  dictBase = (ms->window).base;
  pBStack_68 = (ms->window).dictBase;
  ip._4_4_ = (ms->window).dictLimit;
  if (current < ip._4_4_) {
    local_e0 = pBStack_68 + current;
  }
  else {
    local_e0 = dictBase + current;
  }
  iend = local_e0;
  local_e8 = inputEnd;
  if (current < ip._4_4_) {
    local_e8 = pBStack_68 + ip._4_4_;
  }
  dictEnd = local_e8;
  prefixStart = pBStack_68 + ip._4_4_;
  match = dictBase + ip._4_4_;
  largerPtr = _btMask + ((current & (uint)commonLengthSmaller) << 1);
  _dummy32 = largerPtr + 1;
  windowValid = *largerPtr;
  local_ec = (ms->window).lowLimit;
  uVar1 = 1 << ((byte)((ZSTD_compressionParameters *)bt)->windowLog & 0x1f);
  if (uVar1 < current - local_ec) {
    local_ec = current - uVar1;
  }
  cParams._4_4_ = dictMode;
  local_28 = btLow;
  dictMode_local = nbCompares;
  _btLow_local = inputEnd;
  inputEnd_local._4_4_ = current;
  pZStack_10 = ms;
  if (current < btLow) {
    __assert_fail("current >= btLow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3f34,
                  "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                 );
  }
  if (local_e8 <= local_e0) {
    __assert_fail("ip < iend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3f35,
                  "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                 );
  }
LAB_001f6bee:
  do {
    ZVar2 = dictMode_local - ZSTD_extDict;
    if (dictMode_local == ZSTD_noDict || windowValid <= local_ec) {
LAB_001f6f18:
      *_dummy32 = 0;
      *largerPtr = 0;
      return;
    }
    pUVar3 = _btMask + ((windowValid & (uint)commonLengthSmaller) << 1);
    if (commonLengthLarger < base) {
      local_f8 = (BYTE *)commonLengthLarger;
    }
    else {
      local_f8 = base;
    }
    dictMode_local = ZVar2;
    if (inputEnd_local._4_4_ <= windowValid) {
      __assert_fail("matchIndex < current",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3f3a,
                    "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    if (((cParams._4_4_ == ZSTD_extDict) && (local_f8 + windowValid < (BYTE *)(ulong)ip._4_4_)) &&
       (ip._4_4_ <= inputEnd_local._4_4_)) {
      smallerPtr = (U32 *)(pBStack_68 + windowValid);
      sVar4 = ZSTD_count_2segments
                        (iend + (long)local_f8,(BYTE *)((long)smallerPtr + (long)local_f8),dictEnd,
                         prefixStart,match);
      mBase = local_f8 + sVar4;
      if ((BYTE *)(ulong)ip._4_4_ <= mBase + windowValid) {
        smallerPtr = (U32 *)(dictBase + windowValid);
      }
    }
    else {
      if ((cParams._4_4_ == ZSTD_extDict) && (local_f8 + windowValid < (BYTE *)(ulong)ip._4_4_)) {
        local_100 = pBStack_68;
      }
      else {
        local_100 = dictBase;
      }
      if (local_f8 + windowValid < (BYTE *)(ulong)ip._4_4_ && ip._4_4_ <= inputEnd_local._4_4_) {
        __assert_fail("(matchIndex+matchLength >= dictLimit) || (current < dictLimit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f46,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      smallerPtr = (U32 *)(local_100 + windowValid);
      sVar4 = ZSTD_count(iend + (long)local_f8,(BYTE *)((long)smallerPtr + (long)local_f8),dictEnd);
      mBase = local_f8 + sVar4;
    }
    if (iend + (long)mBase == dictEnd) goto LAB_001f6f18;
    if (iend[(long)mBase] <= *(byte *)((long)smallerPtr + (long)mBase)) {
      *_dummy32 = windowValid;
      base = mBase;
      if (windowValid <= local_28) {
        _dummy32 = &maxDistance;
        goto LAB_001f6f18;
      }
      windowValid = *pUVar3;
      _dummy32 = pUVar3;
      goto LAB_001f6bee;
    }
    *largerPtr = windowValid;
    commonLengthLarger = (size_t)mBase;
    if (windowValid <= local_28) {
      largerPtr = &maxDistance;
      goto LAB_001f6f18;
    }
    largerPtr = pUVar3 + 1;
    windowValid = pUVar3[1];
  } while( true );
}

Assistant:

static void
ZSTD_insertDUBT1(ZSTD_matchState_t* ms,
                 U32 current, const BYTE* inputEnd,
                 U32 nbCompares, U32 btLow,
                 const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const ip = (current>=dictLimit) ? base + current : dictBase + current;
    const BYTE* const iend = (current>=dictLimit) ? inputEnd : dictBase + dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 matchIndex = *smallerPtr;   /* this candidate is unsorted : next sorted candidate is reached through *smallerPtr, while *largerPtr contains previous unsorted candidate (which is already saved and can be overwritten) */
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowValid = ms->window.lowLimit;
    U32 const maxDistance = 1U << cParams->windowLog;
    U32 const windowLow = (current - windowValid > maxDistance) ? current - maxDistance : windowValid;


    DEBUGLOG(8, "ZSTD_insertDUBT1(%u) (dictLimit=%u, lowLimit=%u)",
                current, dictLimit, windowLow);
    assert(current >= btLow);
    assert(ip < iend);   /* condition for ZSTD_count */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);
        /* note : all candidates are now supposed sorted,
         * but it's still possible to have nextPtr[1] == ZSTD_DUBT_UNSORTED_MARK
         * when a real index has the same value as ZSTD_DUBT_UNSORTED_MARK */

        if ( (dictMode != ZSTD_extDict)
          || (matchIndex+matchLength >= dictLimit)  /* both in current segment*/
          || (current < dictLimit) /* both in extDict */) {
            const BYTE* const mBase = ( (dictMode != ZSTD_extDict)
                                     || (matchIndex+matchLength >= dictLimit)) ?
                                        base : dictBase;
            assert( (matchIndex+matchLength >= dictLimit)   /* might be wrong if extDict is incorrectly set to 0 */
                 || (current < dictLimit) );
            match = mBase + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* preparation for next read of match[matchLength] */
        }

        DEBUGLOG(8, "ZSTD_insertDUBT1: comparing %u with %u : found %u common bytes ",
                    current, matchIndex, (U32)matchLength);

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is smaller : next => %u",
                        matchIndex, btLow, nextPtr[1]);
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is larger => %u",
                        matchIndex, btLow, nextPtr[0]);
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
}